

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chemkinReader.cpp
# Opt level: O3

ssize_t __thiscall IO::ChemkinReader::read(ChemkinReader *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  TransportParser transportParser;
  ThermoParser thermoParser;
  string local_120;
  string local_100;
  TransportParser local_e0;
  ThermoParser local_a0;
  
  readGlobalUnits(this);
  readElements(this);
  readSpecies(this);
  pcVar1 = (this->thermfile_)._M_dataplus._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + (this->thermfile_)._M_string_length);
  ThermoParser::ThermoParser(&local_a0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  ThermoParser::parse(&local_a0,&this->species_);
  iVar2 = std::__cxx11::string::compare((char *)&this->transfile_);
  if (iVar2 != 0) {
    pcVar1 = (this->transfile_)._M_dataplus._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar1,pcVar1 + (this->transfile_)._M_string_length);
    TransportParser::TransportParser(&local_e0,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    TransportParser::parse(&local_e0,&this->species_);
    TransportParser::~TransportParser(&local_e0);
  }
  readReactions(this);
  ThermoParser::~ThermoParser(&local_a0);
  return CONCAT44(extraout_var,extraout_EAX);
}

Assistant:

void IO::ChemkinReader::read()
{

    readGlobalUnits();

    readElements();
    readSpecies();

    ThermoParser thermoParser(thermfile_);
    thermoParser.parse(species_);

    if (transfile_ != "NOT READ")
    {
        TransportParser transportParser(transfile_);
        transportParser.parse(species_);
    }

    readReactions();

}